

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O2

size_t __thiscall ktx::ValidationContext::calcLayerSize(ValidationContext *this,uint32_t level)

{
  byte bVar1;
  size_t sVar2;
  byte bVar3;
  uint uVar4;
  
  uVar4 = (this->header).pixelDepth >> ((byte)level & 0x1f);
  bVar3 = 0;
  if ((this->parsedBlockDimension2).super__Optional_base<unsigned_char,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_char>._M_engaged != false) {
    bVar3 = (this->parsedBlockDimension2).super__Optional_base<unsigned_char,_true,_true>._M_payload
            .super__Optional_payload_base<unsigned_char>._M_payload._M_value;
  }
  bVar1 = (this->expectedBlockDimension2).super__Optional_base<unsigned_char,_true,_true>._M_payload
          .super__Optional_payload_base<unsigned_char>._M_payload._M_value;
  if ((this->expectedBlockDimension2).super__Optional_base<unsigned_char,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_char>._M_engaged == false) {
    bVar1 = bVar3;
  }
  uVar4 = ceil_div<unsigned_int>(uVar4 + (uVar4 == 0),bVar1 + 1);
  sVar2 = calcImageSize(this,level);
  return sVar2 * (this->header).faceCount * (ulong)uVar4;
}

Assistant:

size_t ValidationContext::calcLayerSize(uint32_t level) {
    const auto levelDepth = std::max(1u, header.pixelDepth >> level);
    const auto blockDimensionZ = 1u + expectedBlockDimension2.value_or(parsedBlockDimension2.value_or(0u));
    const auto blockCountZ = ceil_div(levelDepth, blockDimensionZ);

    const auto imageSize = calcImageSize(level);
    // As there are no 3D cubemaps, the image's z block count will always be 1 for
    // cubemaps and numFaces will always be 1 for 3D textures so the multiplication is safe.
    // 3D cubemaps, if they existed, would require imageSize * (blockCount.z + This->numFaces);
    return imageSize * blockCountZ * header.faceCount;
}